

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

void Gia_ManEquivImprove(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  int local_44;
  int local_40;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs != NULL && p->pNexts != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x616,"void Gia_ManEquivImprove(Gia_Man_t *)");
  }
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  if (1 < p->nObjs) {
    uVar11 = 1;
    do {
      if ((((uint)p->pReprs[uVar11] & 0xfffffff) == 0xfffffff) && (0 < p->pNexts[uVar11])) {
        p_00->nSize = 0;
        if (p->pNexts[uVar11] < 1) {
          __assert_fail("Gia_ObjIsHead(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x620,"void Gia_ManEquivImprove(Gia_Man_t *)");
        }
        uVar7 = 0xffffffff;
        local_44 = 1000000000;
        local_40 = 1000000000;
        uVar6 = uVar11;
        do {
          uVar10 = (uint)uVar6;
          if (p->nObjs <= (int)uVar10) goto LAB_001fdb59;
          pVVar2 = p->vLevels;
          if (pVVar2->nSize <= (int)uVar10) {
            uVar8 = uVar10 + 1;
            iVar1 = pVVar2->nCap;
            uVar5 = iVar1 * 2;
            if ((int)uVar10 < (int)uVar5) {
              if (iVar1 < (int)uVar5 && iVar1 <= (int)uVar10) {
                if (pVVar2->pArray == (int *)0x0) {
                  piVar4 = (int *)malloc((long)iVar1 << 3);
                }
                else {
                  piVar4 = (int *)realloc(pVVar2->pArray,(long)iVar1 << 3);
                }
                pVVar2->pArray = piVar4;
LAB_001fd9b6:
                if (piVar4 == (int *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                pVVar2->nCap = uVar5;
              }
            }
            else if (iVar1 <= (int)uVar10) {
              if (pVVar2->pArray == (int *)0x0) {
                piVar4 = (int *)malloc((ulong)uVar8 << 2);
              }
              else {
                piVar4 = (int *)realloc(pVVar2->pArray,(ulong)uVar8 << 2);
              }
              pVVar2->pArray = piVar4;
              uVar5 = uVar8;
              goto LAB_001fd9b6;
            }
            iVar1 = pVVar2->nSize;
            if (iVar1 <= (int)uVar10) {
              memset(pVVar2->pArray + iVar1,0,(ulong)(uVar10 - iVar1) * 4 + 4);
            }
            pVVar2->nSize = uVar8;
          }
          if (pVVar2->nSize <= (int)uVar10) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->nObjs <= (int)uVar10) {
LAB_001fdb59:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                          ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          uVar9 = uVar6 & 0xffffffff;
          iVar1 = pVVar2->pArray[uVar9];
          iVar3 = Gia_NodeMffcSize(p,p->pObjs + uVar9);
          if ((iVar1 < local_40) || ((local_40 == iVar1 && (iVar3 < local_44)))) {
            uVar7 = uVar10;
            local_44 = iVar3;
            local_40 = iVar1;
          }
          Vec_IntPush(p_00,uVar10);
          uVar6 = (ulong)(uint)p->pNexts[uVar9];
        } while (0 < p->pNexts[uVar9]);
        uVar10 = p_00->nSize;
        if ((int)uVar10 < 2) {
          __assert_fail("Vec_IntSize( vClass ) > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x62c,"void Gia_ManEquivImprove(Gia_Man_t *)");
        }
        if ((int)uVar7 < 1) {
          __assert_fail("iReprBest > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x62d,"void Gia_ManEquivImprove(Gia_Man_t *)");
        }
        uVar6 = (ulong)uVar7;
        if (uVar11 != uVar6) {
          p->pReprs[uVar6] = (Gia_Rpr_t)((uint)p->pReprs[uVar6] | 0xfffffff);
          p->pReprs[uVar11] = (Gia_Rpr_t)((uint)p->pReprs[uVar11] | 0x10000000);
          p->pReprs[uVar6] = (Gia_Rpr_t)((uint)p->pReprs[uVar6] & 0xefffffff);
          piVar4 = p_00->pArray;
          uVar6 = 0;
          do {
            uVar5 = piVar4[uVar6];
            if (uVar5 != uVar7) {
              if ((uVar7 != 0xfffffff) && ((int)uVar5 <= (int)uVar7)) {
                __assert_fail("Num == GIA_VOID || Num < Id",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                              ,0x3fc,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
              }
              p->pReprs[(int)uVar5] =
                   (Gia_Rpr_t)((uint)p->pReprs[(int)uVar5] & 0xf0000000 | uVar7 & 0xfffffff);
            }
            uVar6 = uVar6 + 1;
          } while (uVar10 != uVar6);
        }
      }
      uVar11 = uVar11 + 1;
    } while ((long)uVar11 < (long)p->nObjs);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p->pNexts != (int *)0x0) {
    free(p->pNexts);
    p->pNexts = (int *)0x0;
  }
  return;
}

Assistant:

void Gia_ManEquivImprove( Gia_Man_t * p )
{
    Vec_Int_t * vClass;
    int i, k, iNode, iRepr;
    int iReprBest, iLevelBest, iLevelCur, iMffcBest, iMffcCur;
    assert( p->pReprs != NULL && p->pNexts != NULL );
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    // iterate over class candidates
    vClass = Vec_IntAlloc( 100 );
    Gia_ManForEachClass( p, i )
    {
        Vec_IntClear( vClass );
        iReprBest = -1;
        iLevelBest = iMffcBest = ABC_INFINITY;
        Gia_ClassForEachObj( p, i, k )
        {
            iLevelCur = Gia_ObjLevel( p,Gia_ManObj(p, k) );
            iMffcCur  = Gia_NodeMffcSize( p, Gia_ManObj(p, k) );
            if ( iLevelBest > iLevelCur || (iLevelBest == iLevelCur && iMffcBest > iMffcCur) )
            {
                iReprBest  = k;
                iLevelBest = iLevelCur;
                iMffcBest  = iMffcCur;
            }
            Vec_IntPush( vClass, k );
        }
        assert( Vec_IntSize( vClass ) > 1 );
        assert( iReprBest > 0 );
        if ( i == iReprBest )
            continue;
/*
        Abc_Print( 1, "Repr/Best = %6d/%6d. Lev = %3d/%3d. Mffc = %3d/%3d.\n", 
            i, iReprBest, Gia_ObjLevel( p,Gia_ManObj(p, i) ), Gia_ObjLevel( p,Gia_ManObj(p, iReprBest) ),
            Gia_NodeMffcSize( p, Gia_ManObj(p, i) ), Gia_NodeMffcSize( p, Gia_ManObj(p, iReprBest) ) );
*/
        iRepr = iReprBest;
        Gia_ObjSetRepr( p, iRepr, GIA_VOID );
        Gia_ObjSetProved( p, i );
        Gia_ObjUnsetProved( p, iRepr );
        Vec_IntForEachEntry( vClass, iNode, k )
            if ( iNode != iRepr )
                Gia_ObjSetRepr( p, iNode, iRepr );
    }
    Vec_IntFree( vClass );
    ABC_FREE( p->pNexts );
//    p->pNexts = Gia_ManDeriveNexts( p );
}